

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::SparseNode::MergeFrom(SparseNode *this,SparseNode *from)

{
  char *pcVar1;
  InternalMetadataWithArenaLite *this_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c;
  int __c_00;
  double dVar2;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  SparseNode *local_58;
  SparseNode *from_local;
  SparseNode *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  LogMessage *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O0/mlmodel/format/SVM.pb.cc"
               ,0x6bf);
    local_91 = 1;
    from = (SparseNode *)
           google::protobuf::internal::LogMessage::operator<<
                     (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,(LogMessage *)from);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_00 = &this->_internal_metadata_;
  this_local = (SparseNode *)&local_58->_internal_metadata_;
  local_40 = this_00;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (LogMessage *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (LogMessage *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    from = (SparseNode *)local_20;
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_00,(string *)local_20);
  }
  dVar2 = value(local_58);
  if ((dVar2 != 0.0) || (__c = extraout_EDX, NAN(dVar2))) {
    dVar2 = value(local_58);
    set_value(this,dVar2);
    __c = extraout_EDX_00;
  }
  pcVar1 = index(local_58,(char *)from,__c);
  if ((int)pcVar1 != 0) {
    pcVar1 = index(local_58,(char *)from,__c_00);
    set_index(this,(int32)pcVar1);
  }
  return;
}

Assistant:

void SparseNode::MergeFrom(const SparseNode& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SparseNode)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.value() != 0) {
    set_value(from.value());
  }
  if (from.index() != 0) {
    set_index(from.index());
  }
}